

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O1

void __thiscall
NaPNStatistics::configure_output(NaPNStatistics *this,char *szStatMask,char *szDelim)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char *szStatText;
  uint uVar4;
  uint uVar5;
  undefined8 uStack_30;
  
  if (szDelim != (char *)0x0 && szStatMask != (char *)0x0) {
    uStack_30 = 0x1408b6;
    sVar3 = strlen(szStatMask);
    lVar1 = -(sVar3 + 0x10 & 0xfffffffffffffff0);
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1408d2;
    strcpy(&stack0xffffffffffffffd8 + lVar1,szStatMask);
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1408dd;
    szStatText = strtok(&stack0xffffffffffffffd8 + lVar1,szDelim);
    if (szStatText == (char *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1408f0;
        iVar2 = NaStatTextToId(szStatText);
        uVar4 = 1 << ((byte)iVar2 & 0x1f);
        if (iVar2 == -1) {
          uVar4 = 0;
        }
        uVar5 = uVar5 | uVar4;
        *(undefined8 *)((long)&uStack_30 + lVar1) = 0x14090d;
        szStatText = strtok((char *)0x0,szDelim);
      } while (szStatText != (char *)0x0);
    }
    if (uVar5 != 0) {
      *(undefined8 *)((long)&uStack_30 + lVar1) = 0x140924;
      NaPetriNode::check_tunable(&this->super_NaPetriNode);
      this->mOutStat = uVar5;
    }
  }
  return;
}

Assistant:

void
NaPNStatistics::configure_output (const char* szStatMask, const char* szDelim)
{
    if(NULL == szStatMask || NULL == szDelim)
	return;

    char *token, *statmask = (char*)alloca(strlen(szStatMask) + 1);
    int resmask = 0;

    strcpy(statmask, szStatMask);

    for(token = strtok(statmask, szDelim); NULL != token;
	token = strtok(NULL, szDelim))
	{
	    int	id = NaStatTextToId(token);

	    if(id != NaSI_bad_id)
		resmask |= NaSIdToMask(id);
	}
    if(0 != resmask)
	configure_output(resmask);
}